

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O3

void __thiscall Rml::ElementEffects::ReloadEffectsData(ElementEffects *this)

{
  undefined8 *puVar1;
  RenderManager *pRVar2;
  unsigned_long uVar3;
  long lVar4;
  DecoratorEntry *decorator;
  undefined8 *puVar5;
  bool bVar6;
  long lVar7;
  String local_68;
  CompiledFilter local_48;
  long local_38;
  
  if (this->effects_data_dirty == true) {
    this->effects_data_dirty = false;
    local_68._M_dataplus._M_p = (pointer)&this->decorators;
    local_68._M_string_length = (size_type)&this->mask_images;
    bVar6 = false;
    lVar7 = 0;
    do {
      puVar5 = *(undefined8 **)((long)&local_68._M_dataplus._M_p + lVar7);
      puVar1 = (undefined8 *)puVar5[1];
      for (puVar5 = (undefined8 *)*puVar5; puVar5 != puVar1; puVar5 = puVar5 + 4) {
        if (puVar5[2] != 0) {
          (**(code **)(*(long *)*puVar5 + 0x18))();
        }
        lVar4 = (**(code **)(*(long *)*puVar5 + 0x10))
                          ((long *)*puVar5,this->element,*(undefined4 *)(puVar5 + 3));
        puVar5[2] = lVar4;
        bVar6 = (bool)(bVar6 | lVar4 == 0);
      }
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x10);
    if (bVar6) {
      Element::GetAddress_abi_cxx11_(&local_68,this->element,false,true);
      Log::Message(LT_WARNING,"Could not generate decorator element data: %s",
                   local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    local_68._M_dataplus._M_p = (pointer)&this->filters;
    local_68._M_string_length = (size_type)&this->backdrop_filters;
    lVar7 = 0;
    bVar6 = false;
    do {
      local_38 = lVar7;
      puVar5 = *(undefined8 **)((long)&local_68._M_dataplus._M_p + lVar7);
      puVar1 = (undefined8 *)puVar5[1];
      for (puVar5 = (undefined8 *)*puVar5; puVar5 != puVar1; puVar5 = puVar5 + 4) {
        (**(code **)(*(long *)*puVar5 + 0x10))(&local_48,(long *)*puVar5,this->element);
        CompiledFilter::Release((CompiledFilter *)(puVar5 + 2));
        uVar3 = local_48.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.
                resource_handle;
        pRVar2 = local_48.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.
                 render_manager;
        local_48.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.render_manager
             = (RenderManager *)0x0;
        (((CompiledFilter *)(puVar5 + 2))->
        super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>).render_manager = pRVar2
        ;
        local_48.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.resource_handle
             = 0;
        puVar5[3] = uVar3;
        CompiledFilter::Release(&local_48);
        bVar6 = (bool)(bVar6 | puVar5[3] == 0);
      }
      lVar7 = local_38 + 8;
    } while (lVar7 != 0x10);
    if (bVar6) {
      Element::GetAddress_abi_cxx11_(&local_68,this->element,false,true);
      Log::Message(LT_WARNING,"Could not compile filter on element: %s",local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void ElementEffects::ReloadEffectsData()
{
	if (effects_data_dirty)
	{
		effects_data_dirty = false;

		bool decorator_data_failed = false;
		for (DecoratorEntryList* list : {&decorators, &mask_images})
		{
			for (DecoratorEntry& decorator : *list)
			{
				if (decorator.decorator_data)
					decorator.decorator->ReleaseElementData(decorator.decorator_data);

				decorator.decorator_data = decorator.decorator->GenerateElementData(element, decorator.paint_area);
				if (!decorator.decorator_data)
					decorator_data_failed = true;
			}
		}

		if (decorator_data_failed)
			Log::Message(Log::LT_WARNING, "Could not generate decorator element data: %s", element->GetAddress().c_str());

		bool filter_compile_failed = false;
		for (FilterEntryList* list : {&filters, &backdrop_filters})
		{
			for (FilterEntry& filter : *list)
			{
				filter.compiled = filter.filter->CompileFilter(element);
				if (!filter.compiled)
					filter_compile_failed = true;
			}
		}

		if (filter_compile_failed)
			Log::Message(Log::LT_WARNING, "Could not compile filter on element: %s", element->GetAddress().c_str());
	}
}